

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

CBlockIndex * __thiscall CChain::FindFork(CChain *this,CBlockIndex *pindex)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (pindex != (CBlockIndex *)0x0) {
    iVar3 = (int)((ulong)((long)(this->vChain).
                                super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->vChain).
                               super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                               _M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar3 <= pindex->nHeight) {
      pindex = CBlockIndex::GetAncestor(pindex,iVar3 + -1);
    }
    for (; pindex != (CBlockIndex *)0x0; pindex = pindex->pprev) {
      bVar2 = Contains(this,pindex);
      if (bVar2) goto LAB_006c09fb;
    }
  }
  pindex = (CBlockIndex *)0x0;
LAB_006c09fb:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return pindex;
  }
  __stack_chk_fail();
}

Assistant:

const CBlockIndex *CChain::FindFork(const CBlockIndex *pindex) const {
    if (pindex == nullptr) {
        return nullptr;
    }
    if (pindex->nHeight > Height())
        pindex = pindex->GetAncestor(Height());
    while (pindex && !Contains(pindex))
        pindex = pindex->pprev;
    return pindex;
}